

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_string * mg_string_make2(uint32_t len,char *data)

{
  mg_string *pmVar1;
  
  pmVar1 = (mg_string *)mg_allocator_malloc(&mg_system_allocator,(ulong)len + 0x10);
  if (pmVar1 == (mg_string *)0x0) {
    pmVar1 = (mg_string *)0x0;
  }
  else {
    pmVar1->data = (char *)(pmVar1 + 1);
  }
  if (pmVar1 == (mg_string *)0x0) {
    pmVar1 = (mg_string *)0x0;
  }
  else {
    pmVar1->size = len;
    memcpy(pmVar1->data,data,(ulong)len);
  }
  return pmVar1;
}

Assistant:

mg_string *mg_string_make2(uint32_t len, const char *data) {
  mg_string *str = mg_string_alloc(len, &mg_system_allocator);
  if (!str) {
    return NULL;
  }
  str->size = len;
  memcpy(str->data, data, len);
  return str;
}